

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lut.c
# Opt level: O2

_Bool chck_hash_table_str_set(chck_hash_table *table,char *str,size_t len,void *data)

{
  ulong uVar1;
  _Bool _Var2;
  uint32_t uVar3;
  int iVar4;
  header *h;
  chck_hash_table *l;
  chck_hash_table *table_00;
  uint32_t index;
  
  if ((table == (chck_hash_table *)0x0) || (str == (char *)0x0)) {
    __assert_fail("table && str",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/lut/lut.c",
                  0x188,
                  "_Bool chck_hash_table_str_set(struct chck_hash_table *, const char *, size_t, const void *)"
                 );
  }
  uVar3 = (*(table->lut).hashstr)(str,len);
  uVar1 = (table->lut).count;
  while( true ) {
    l = table;
    index = (uint32_t)((ulong)uVar3 % uVar1);
    h = (header *)lut_get_index(&l->meta,index);
    table_00 = l;
    if (h == (header *)0x0) break;
    if ((h->placed != true) ||
       ((h->str_key != (char *)0x0 && (iVar4 = strcmp(h->str_key,str), iVar4 == 0))))
    goto LAB_0010199e;
    table = l->next;
    table_00 = (chck_hash_table *)0x0;
    if (l->next == (chck_hash_table *)0x0) break;
  }
  h = (header *)0x0;
LAB_0010199e:
  _Var2 = hash_table_set(table_00,l,h,index,str,0xffffffff,data);
  return _Var2;
}

Assistant:

bool
chck_hash_table_str_set(struct chck_hash_table *table, const char *str, size_t len, const void *data)
{
   assert(table && str);
   return hash_table_set_str(table, table->lut.hashstr(str, len) % table->lut.count, str, data);
}